

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMaterialShellReissner.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChPlasticityReissner::ComputeStiffnessMatrixElastoplastic
          (ChPlasticityReissner *this,ChMatrixRef *K,ChVector<double> *eps_u,ChVector<double> *eps_v
          ,ChVector<double> *kur_u,ChVector<double> *kur_v,ChShellReissnerInternalData *data,
          double z_inf,double z_sup,double angle)

{
  long lVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  ChMatrixRef *pCVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  double *pdVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  ChVector<double> n_u;
  ChVector<double> m_u;
  ChVectorN<double,_12> stress_1;
  ChVector<double> m_v;
  ChVector<double> n_v;
  Index alignedStart_2;
  Index alignedStart_1;
  Index alignedEnd;
  ChVectorN<double,_12> strain_0;
  vector<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>_>_>
  b_plastic_data;
  vector<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>_>_>
  a_plastic_data;
  ChVectorN<double,_12> stress_0;
  ChVector<double> dkur_u;
  ChVector<double> deps_v;
  ChVector<double> deps_u;
  ChVectorN<double,_12> stress_d;
  ChVector<double> dkur_v;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  double *local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  double *pdStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  void *local_2e8;
  void *local_2e0;
  void *local_2d8;
  void *local_2d0;
  undefined8 *local_2c8;
  double **local_2c0;
  ulong local_2b8;
  ulong local_2b0;
  size_t local_2a8;
  undefined8 local_2a0;
  ulong local_298;
  ulong local_290;
  ulong local_288;
  ulong local_280;
  undefined8 local_278;
  ChMatrixRef *local_270;
  ChPlasticityReissner *local_268;
  double local_260 [3];
  double local_248 [3];
  double local_230 [3];
  double local_218;
  double dStack_210;
  double local_208;
  vector<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>_>_>
  local_200;
  vector<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>_>_>
  local_1e0;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [32];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  ChVector<double> local_148;
  ChVector<double> local_130;
  ChVector<double> local_118;
  double local_100 [13];
  ChVector<double> local_98;
  PointerType local_80;
  long lStack_78;
  long local_70;
  long local_68;
  
  local_3c0 = 0;
  uStack_3b8 = 0;
  local_3b0 = 0;
  local_2f0 = 0;
  local_300 = 0;
  uStack_2f8 = 0;
  local_390 = 0;
  local_3a0 = 0;
  uStack_398 = 0;
  local_310 = 0;
  local_320 = 0;
  uStack_318 = 0;
  local_1e0.
  super__Vector_base<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e0.
  super__Vector_base<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e0.
  super__Vector_base<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (*this->_vptr_ChPlasticityReissner[4])(this,1);
  local_200.
  super__Vector_base<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_200.
  super__Vector_base<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_200.
  super__Vector_base<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*this->_vptr_ChPlasticityReissner[4])(this,1);
  iVar9 = (*this->_vptr_ChPlasticityReissner[2])
                    (z_inf,z_sup,angle,this,&local_3c0,&local_300,&local_3a0,&local_320,
                     ((local_1e0.
                       super__Vector_base<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                     super___uniq_ptr_impl<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_chrono::fea::ChShellReissnerInternalData_*,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>
                     .super__Head_base<0UL,_chrono::fea::ChShellReissnerInternalData_*,_false>.
                     _M_head_impl,eps_u,eps_v,kur_u,kur_v,data);
  if ((char)iVar9 == '\0') {
    peVar2 = (this->section->elasticity).
             super___shared_ptr<chrono::fea::ChElasticityReissner,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    this_00 = (this->section->elasticity).
              super___shared_ptr<chrono::fea::ChElasticityReissner,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    local_70 = (K->
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               ).
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
               .
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
               .m_cols.m_value;
    local_80 = (K->
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               ).
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
               .
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
               .m_data;
    lStack_78 = (K->
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                ).
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                .m_rows.m_value;
    local_68 = (K->
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               ).m_stride.m_outer.m_value;
    (*peVar2->_vptr_ChElasticityReissner[3])
              (z_inf,z_sup,angle,peVar2,&local_80,eps_u,eps_v,kur_u,kur_v);
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  else {
    uVar11 = -((uint)((ulong)local_260 >> 3) & 0x1fffffff) & 4;
    uVar14 = 3;
    if (uVar11 < 3) {
      uVar14 = uVar11;
    }
    if (uVar11 != 0) {
      local_260[2] = eps_u->m_data[2];
      local_260[0] = eps_u->m_data[0];
      local_260[1] = eps_u->m_data[1];
    }
    local_268 = this;
    if (uVar14 != 3) {
      uVar10 = (ulong)(uVar14 << 3);
      memcpy((void *)((long)local_260 + uVar10),(void *)((long)eps_u->m_data + uVar10),0x18 - uVar10
            );
    }
    uVar14 = -((uint)((ulong)local_248 >> 3) & 0x1fffffff) & 5;
    if (2 < uVar14) {
      uVar14 = 3;
    }
    memcpy(local_248,eps_v,(ulong)(uVar14 * 8));
    if (uVar14 != 3) {
      uVar10 = (ulong)(uVar14 << 3);
      memcpy((void *)((long)local_248 + uVar10),(void *)((long)eps_v->m_data + uVar10),0x18 - uVar10
            );
    }
    uVar11 = -((uint)((ulong)local_230 >> 3) & 0x1fffffff) & 6;
    uVar14 = 3;
    if (uVar11 < 3) {
      uVar14 = uVar11;
    }
    memcpy(local_230,kur_u,(ulong)(uVar14 * 8));
    if (uVar14 != 3) {
      uVar10 = (ulong)(uVar14 << 3);
      memcpy((void *)((long)local_230 + uVar10),(void *)((long)kur_u->m_data + uVar10),0x18 - uVar10
            );
    }
    local_208 = kur_v->m_data[2];
    local_218 = kur_v->m_data[0];
    dStack_210 = kur_v->m_data[1];
    memcpy(&local_1c0,&local_3c0,0x18);
    uVar14 = -((uint)((ulong)&uStack_1a8 >> 3) & 0x1fffffff) & 5;
    if (2 < uVar14) {
      uVar14 = 3;
    }
    memcpy(&uStack_1a8,&local_300,(ulong)(uVar14 * 8));
    if (uVar14 != 3) {
      uVar10 = (ulong)(uVar14 << 3);
      memcpy(local_1a0 + (uVar10 - 8),(void *)((long)&local_300 + uVar10),0x18 - uVar10);
    }
    uVar11 = -((uint)((ulong)(local_1a0 + 0x10) >> 3) & 0x1fffffff) & 6;
    uVar14 = 3;
    if (uVar11 < 3) {
      uVar14 = uVar11;
    }
    memcpy(local_1a0 + 0x10,&local_3a0,(ulong)(uVar14 * 8));
    if (uVar14 != 3) {
      uVar10 = (ulong)(uVar14 << 3);
      memcpy(local_1a0 + uVar10 + 0x10,(void *)((long)&local_3a0 + uVar10),0x18 - uVar10);
    }
    uStack_168 = local_310;
    uStack_178 = local_320;
    uStack_170 = uStack_318;
    local_278 = 0;
    local_280 = (ulong)(-((uint)((ulong)&pdStack_368 >> 3) & 0x1fffffff) & 5);
    if (2 < local_280) {
      local_280 = 3;
    }
    local_288 = (ulong)(-((uint)((ulong)&uStack_350 >> 3) & 0x1fffffff) & 6);
    if (2 < local_288) {
      local_288 = 3;
    }
    local_2a0 = 0;
    local_2a8 = 0x18;
    local_290 = (ulong)(uint)((int)local_280 * 8);
    local_298 = (ulong)(uint)((int)local_288 * 8);
    local_2b0 = local_290 ^ 0x18;
    local_2b8 = local_298 ^ 0x18;
    local_2c0 = &local_380;
    local_2c8 = &local_3c0;
    local_2d0 = (void *)((long)&pdStack_368 + local_290);
    local_2d8 = (void *)((long)&local_300 + local_290);
    local_2e0 = (void *)((long)&uStack_350 + local_298);
    local_2e8 = (void *)((long)&local_3a0 + local_298);
    lVar15 = 0;
    lVar16 = 0;
    local_270 = K;
    do {
      local_260[lVar16] = local_260[lVar16] + 1e-06;
      uStack_378 = 3;
      local_360 = 0;
      uStack_350 = 0xc;
      local_380 = local_260;
      pdStack_368 = local_260;
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>>
                (&local_118,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *)
                 &local_380,(type *)0x0);
      local_380 = local_248;
      uStack_378 = 3;
      local_360 = 3;
      uStack_350 = 0xc;
      pdStack_368 = local_260;
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>>
                (&local_130,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *)
                 &local_380,(type *)0x0);
      local_380 = local_230;
      uStack_378 = 3;
      local_360 = 6;
      uStack_350 = 0xc;
      pdStack_368 = local_260;
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>>
                (&local_148,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *)
                 &local_380,(type *)0x0);
      local_380 = &local_218;
      uStack_378 = 3;
      local_360 = 9;
      uStack_350 = 0xc;
      pdStack_368 = local_260;
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>>
                (&local_98,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *)
                 &local_380,(type *)0x0);
      (*local_268->_vptr_ChPlasticityReissner[2])
                (z_inf,z_sup,angle,local_268,&local_3c0,&local_300,&local_3a0,&local_320,
                 ((local_200.
                   super__Vector_base<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                 super___uniq_ptr_impl<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_chrono::fea::ChShellReissnerInternalData_*,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>
                 .super__Head_base<0UL,_chrono::fea::ChShellReissnerInternalData_*,_false>.
                 _M_head_impl,&local_118,&local_130,&local_148,&local_98,data);
      pCVar8 = local_270;
      if ((int)local_278 != 3) {
        memcpy(local_2c0,local_2c8,local_2a8);
      }
      memcpy(&pdStack_368,&local_300,local_290);
      if ((int)local_280 != 3) {
        memcpy(local_2d0,local_2d8,local_2b0);
      }
      memcpy(&uStack_350,&local_3a0,local_298);
      if ((int)local_288 != 3) {
        memcpy(local_2e0,local_2e8,local_2b8);
      }
      uStack_328 = local_310;
      uStack_338 = local_320;
      uStack_330 = uStack_318;
      auVar3._8_8_ = uStack_378;
      auVar3._0_8_ = local_380;
      auVar3._16_8_ = uStack_370;
      auVar3._24_8_ = pdStack_368;
      auVar4._8_8_ = uStack_358;
      auVar4._0_8_ = local_360;
      auVar4._16_8_ = uStack_350;
      auVar4._24_8_ = uStack_348;
      auVar5._8_8_ = local_320;
      auVar5._0_8_ = local_340;
      auVar5._16_8_ = uStack_318;
      auVar5._24_8_ = local_310;
      auVar6._8_8_ = uStack_1b8;
      auVar6._0_8_ = local_1c0;
      auVar6._16_8_ = uStack_1b0;
      auVar6._24_8_ = uStack_1a8;
      auVar3 = vsubpd_avx(auVar3,auVar6);
      local_100[0] = auVar3._0_8_ * 1000000.0;
      local_100[1] = auVar3._8_8_ * 1000000.0;
      local_100[2] = auVar3._16_8_ * 1000000.0;
      local_100[3] = auVar3._24_8_ * 1000000.0;
      auVar3 = vsubpd_avx(auVar4,local_1a0);
      local_100[4] = auVar3._0_8_ * 1000000.0;
      local_100[5] = auVar3._8_8_ * 1000000.0;
      local_100[6] = auVar3._16_8_ * 1000000.0;
      local_100[7] = auVar3._24_8_ * 1000000.0;
      auVar7._8_8_ = uStack_178;
      auVar7._0_8_ = local_180;
      auVar7._16_8_ = uStack_170;
      auVar7._24_8_ = uStack_168;
      auVar3 = vsubpd_avx(auVar5,auVar7);
      local_100[8] = auVar3._0_8_ * 1000000.0;
      local_100[9] = auVar3._8_8_ * 1000000.0;
      local_100[10] = auVar3._16_8_ * 1000000.0;
      local_100[0xb] = auVar3._24_8_ * 1000000.0;
      if (((pCVar8->
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           ).
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_rows.m_value < 0xc) ||
         ((pCVar8->
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          ).
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_cols.m_value <= lVar16)) {
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                      "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
                     );
      }
      lVar1 = (pCVar8->
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              ).m_stride.m_outer.m_value;
      pdVar12 = (double *)
                ((long)(pCVar8->
                       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                       ).
                       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                       .
                       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                       .m_data + lVar15);
      lVar13 = 0;
      do {
        *pdVar12 = local_100[lVar13];
        lVar13 = lVar13 + 1;
        pdVar12 = pdVar12 + lVar1;
      } while (lVar13 != 0xc);
      local_260[lVar16] = local_260[lVar16] + -1e-06;
      lVar16 = lVar16 + 1;
      lVar15 = lVar15 + 8;
    } while (lVar16 != 0xc);
  }
  std::
  vector<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>_>_>
  ::~vector(&local_200);
  std::
  vector<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChShellReissnerInternalData,_std::default_delete<chrono::fea::ChShellReissnerInternalData>_>_>_>
  ::~vector(&local_1e0);
  return;
}

Assistant:

void ChPlasticityReissner::ComputeStiffnessMatrixElastoplastic(
							ChMatrixRef K,        ///< 12x12 material elastoplastic stiffness matrix values here
							const ChVector<>& eps_u,  ///< strains along \e u direction
							const ChVector<>& eps_v,  ///< strains along \e v direction
							const ChVector<>& kur_u,  ///< curvature along \e u direction
							const ChVector<>& kur_v,  ///< curvature along \e v direction
							const ChShellReissnerInternalData& data,  ///< updated material internal variables, at this point including {p_strain_e, p_strain_k, p_strain_acc}
							const double z_inf,       ///< layer lower z value (along thickness coord)
							const double z_sup,       ///< layer upper z value (along thickness coord)
							const double angle        ///< layer angle respect to x (if needed) 
) {
    ChVector<> n_u;
	ChVector<> n_v;
    ChVector<> m_u;
    ChVector<> m_v;

    std::vector<std::unique_ptr<ChShellReissnerInternalData>> a_plastic_data;
    this->CreatePlasticityData(1, a_plastic_data);
    std::vector<std::unique_ptr<ChShellReissnerInternalData>> b_plastic_data;
    this->CreatePlasticityData(1, b_plastic_data);

	bool in_plastic = ComputeStressWithReturnMapping(n_u, n_v, m_u, m_v,          
		*a_plastic_data[0], eps_u, eps_v, kur_u, kur_v, data, z_inf, z_sup,  angle        
	);


    if (!in_plastic) {

        // if no return mapping is needed at this strain state, just use elastic matrix:
        
		return this->section->GetElasticity()->ComputeStiffnessMatrix(K,eps_u, eps_v, kur_u, kur_v, z_inf, z_sup,  angle);

    } else {
		
		// if return mapping is needed at this strain state, compute the elastoplastic stiffness by brute force BDF

		ChVectorN<double, 12> strain_0;
		strain_0.segment(0, 3) = eps_u.eigen();
		strain_0.segment(3, 3) = eps_v.eigen();
		strain_0.segment(6, 3) = kur_u.eigen();
		strain_0.segment(9, 3) = kur_v.eigen();

		ChVectorN<double, 12> stress_0;
		stress_0.segment(0,3) = n_u.eigen();
		stress_0.segment(3,3) = n_v.eigen();
		stress_0.segment(6,3) = m_u.eigen();
		stress_0.segment(9,3) = m_v.eigen();

		double delta = 1e-6;
		double invdelta = 1.0 / delta;
		for (int i = 0; i < 12; ++i) {
			strain_0(i, 0) += delta;
			ChVector<> deps_u(strain_0.segment(0, 3));
			ChVector<> deps_v(strain_0.segment(3, 3));
			ChVector<> dkur_u(strain_0.segment(6, 3));
			ChVector<> dkur_v(strain_0.segment(9, 3));
			this->ComputeStressWithReturnMapping(n_u, n_v, m_u, m_v, *b_plastic_data[0], deps_u, deps_v, dkur_u, dkur_v, data, z_inf, z_sup, angle);
			ChVectorN<double, 12> stress_1;
			stress_1.segment(0,3) = n_u.eigen();
			stress_1.segment(3,3) = n_v.eigen();
			stress_1.segment(6,3) = m_u.eigen();
			stress_1.segment(9,3) = m_v.eigen();
			ChVectorN<double, 12> stress_d = invdelta * (stress_1 - stress_0);
			K.block(0, i, 12, 1) = stress_d;
			strain_0(i, 0) -= delta;
		}

     
    }
}